

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

char * message_sound_name(int message)

{
  char *pcStack_10;
  int message_local;
  
  if ((message < 0) || (0x98 < message)) {
    pcStack_10 = (char *)0x0;
  }
  else {
    pcStack_10 = message_sound_name::sound_names[message];
  }
  return pcStack_10;
}

Assistant:

const char *message_sound_name(int message)
{
	static const char *sound_names[] = {
		#define MSG(x, s) s,
		#include "list-message.h"
		#undef MSG
	};

	if (message < MSG_GENERIC || message >= MSG_MAX)
		return NULL;

	return sound_names[message];
}